

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void http_handler(mg_connection *nc,int ev,void *ev_data)

{
  char *__dest;
  size_t *psVar1;
  byte *pbVar2;
  byte bVar3;
  mg_connection *pmVar4;
  ushort *puVar5;
  int iVar6;
  uint uVar7;
  mg_str *pmVar8;
  void *pvVar9;
  ushort **ppuVar10;
  __int32_t **pp_Var11;
  long lVar12;
  size_t __n;
  char *pcVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  char *__n_00;
  ulong uVar17;
  char *pcVar18;
  size_t sVar19;
  char *pcVar20;
  http_message shm;
  size_t local_5e8;
  char *local_5d0;
  http_message local_5a8;
  
  pmVar4 = nc->listener;
  uVar7 = (uint)(pmVar4 != (mg_connection *)0x0);
  if (ev == 5) {
    sVar14 = (nc->recv_mbuf).len;
    if ((sVar14 != 0) &&
       (iVar6 = mg_parse_http((nc->recv_mbuf).buf,(int)sVar14,&local_5a8,uVar7), 0 < iVar6)) {
      local_5a8.message.len = (nc->recv_mbuf).len;
      local_5a8.body.len =
           (size_t)((nc->recv_mbuf).buf + (local_5a8.message.len - (long)local_5a8.body.p));
      mg_call(nc,nc->handler,(pmVar4 == (mg_connection *)0x0) + 100,&local_5a8);
    }
    free_http_proto_data(nc);
  }
  if (nc->proto_data != (void *)0x0) {
    transfer_file_data(nc);
  }
  mg_call(nc,nc->handler,ev,ev_data);
  if (ev != 3) {
    return;
  }
  uVar7 = mg_parse_http((nc->recv_mbuf).buf,(int)(nc->recv_mbuf).len,&local_5a8,uVar7);
  if ((0 < (int)uVar7) &&
     (pmVar8 = mg_get_http_header(&local_5a8,"Transfer-Encoding"), pmVar8 != (mg_str *)0x0)) {
    uVar16 = pmVar8->len;
    sVar14 = 7;
    if (uVar16 < 7) {
      sVar14 = uVar16;
    }
    iVar6 = mg_ncasecmp(pmVar8->p,"chunked",sVar14);
    if (((int)uVar16 == 7) && (iVar6 == 0)) {
      pcVar20 = (nc->recv_mbuf).buf + uVar7;
      sVar14 = (nc->recv_mbuf).len;
      if (nc->proto_data == (void *)0x0) {
        pvVar9 = calloc(1,0x30);
        nc->proto_data = pvVar9;
        if (pvVar9 == (void *)0x0) {
          pbVar2 = (byte *)((long)&nc->flags + 1);
          *pbVar2 = *pbVar2 | 8;
          goto LAB_0010cc48;
        }
      }
      pcVar18 = (char *)(sVar14 - uVar7);
      pvVar9 = nc->proto_data;
      pcVar13 = *(char **)((long)pvVar9 + 0x18);
      __n_00 = pcVar13;
      if (pcVar18 < pcVar13) {
        __assert_fail("blen >= body_len",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CryptXor[P]jetservd/mongoose.c"
                      ,0x11d6,
                      "size_t mg_handle_chunked(struct mg_connection *, struct http_message *, char *, size_t)"
                     );
      }
      do {
        uVar16 = (long)pcVar18 - (long)pcVar13;
        if (uVar16 == 0) {
          sVar19 = 0;
          uVar15 = 0;
        }
        else {
          ppuVar10 = __ctype_b_loc();
          puVar5 = *ppuVar10;
          sVar19 = 0;
          uVar17 = 0;
          do {
            bVar3 = pcVar20[(long)(pcVar13 + uVar17)];
            uVar15 = uVar17;
            if ((*(byte *)((long)puVar5 + (ulong)bVar3 * 2 + 1) & 0x10) == 0) break;
            if ((byte)(bVar3 - 0x30) < 10) {
              iVar6 = bVar3 - 0x30;
            }
            else {
              pp_Var11 = __ctype_tolower_loc();
              iVar6 = (*pp_Var11)[bVar3] + -0x57;
            }
            sVar19 = (long)iVar6 + sVar19 * 0x10;
            uVar17 = uVar17 + 1;
            uVar15 = uVar16;
          } while (uVar16 != uVar17);
        }
        if ((((uVar15 == 0) || (uVar17 = uVar15 + 2, uVar16 < uVar17)) ||
            (pcVar20[(long)(pcVar13 + uVar15)] != '\r')) ||
           (pcVar20[(long)(pcVar13 + uVar15 + 1)] != '\n')) {
LAB_0010cabb:
          uVar15 = 0;
        }
        else {
          local_5d0 = pcVar20 + (long)(pcVar13 + uVar17);
          lVar12 = uVar17 + sVar19;
          local_5e8 = sVar19;
          if ((lVar12 == 0) || (uVar15 = lVar12 + 2, uVar16 < uVar15)) goto LAB_0010cabb;
          if (pcVar20[(long)(pcVar13 + lVar12)] == '\r') {
            if (pcVar20[(long)(pcVar13 + lVar12 + 1)] != '\n') {
              uVar15 = 0;
            }
          }
          else {
            uVar15 = 0;
          }
        }
        if (uVar15 == 0) break;
        memmove(pcVar20 + (long)__n_00,local_5d0,local_5e8);
        __n_00 = __n_00 + local_5e8;
        pcVar13 = pcVar13 + uVar15;
        local_5a8.body.len = (size_t)__n_00;
      } while (local_5e8 != 0);
      sVar19 = (long)pcVar13 - (long)__n_00;
      if (__n_00 <= pcVar13 && sVar19 != 0) {
        __n = (long)pcVar18 - (long)pcVar13;
        if (pcVar18 < pcVar13) {
          __assert_fail("i <= blen",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CryptXor[P]jetservd/mongoose.c"
                        ,0x11e9,
                        "size_t mg_handle_chunked(struct mg_connection *, struct http_message *, char *, size_t)"
                       );
        }
        __dest = pcVar20 + (long)__n_00;
        memmove(__dest,pcVar20 + (long)pcVar13,__n);
        memset(__dest + ((long)pcVar18 - (long)pcVar13),0,sVar19);
        psVar1 = &(nc->recv_mbuf).len;
        *psVar1 = *psVar1 - sVar19;
        *(char **)((long)pvVar9 + 0x18) = __n_00;
        pbVar2 = (byte *)((long)&nc->flags + 1);
        *pbVar2 = *pbVar2 & 0xdf;
        mg_call(nc,nc->handler,0x66,&local_5a8);
        if ((nc->flags & 0x2000) != 0) {
          memset(pcVar20,0,(size_t)__n_00);
          memmove(pcVar20,__dest,__n);
          psVar1 = &(nc->recv_mbuf).len;
          *psVar1 = *psVar1 - (long)__n_00;
          *(undefined8 *)((long)pvVar9 + 0x18) = 0;
          local_5a8.body.len = 0;
        }
        if (uVar15 != 0) {
          local_5a8.message.len = __n + *(long *)((long)pvVar9 + 0x18);
        }
      }
    }
  }
LAB_0010cc48:
  if (-1 < (int)uVar7) {
    if (uVar7 != 0) {
      pmVar4 = nc->listener;
      if (pmVar4 == (mg_connection *)0x0) {
        pmVar8 = mg_get_http_header(&local_5a8,"Sec-WebSocket-Accept");
        if (pmVar8 == (mg_str *)0x0) goto LAB_0010cda8;
        uVar15 = (ulong)uVar7;
        uVar16 = (nc->recv_mbuf).len;
        if (uVar15 <= uVar16) {
          pcVar20 = (nc->recv_mbuf).buf;
          memmove(pcVar20,pcVar20 + uVar15,uVar16 - uVar15);
          psVar1 = &(nc->recv_mbuf).len;
          *psVar1 = *psVar1 - uVar15;
        }
        nc->proto_handler = websocket_handler;
        *(byte *)&nc->flags = (byte)nc->flags | 0x80;
      }
      else {
        pmVar8 = mg_get_http_header(&local_5a8,"Sec-WebSocket-Key");
        if (pmVar8 == (mg_str *)0x0) {
LAB_0010cda8:
          if ((nc->recv_mbuf).len < local_5a8.message.len) {
            return;
          }
          mg_call(nc,nc->handler,(pmVar4 == (mg_connection *)0x0) + 100,&local_5a8);
          sVar14 = local_5a8.message.len;
          if (local_5a8.message.len == 0) {
            return;
          }
          uVar16 = (nc->recv_mbuf).len;
          if (uVar16 < local_5a8.message.len) {
            return;
          }
          pcVar20 = (nc->recv_mbuf).buf;
          memmove(pcVar20,pcVar20 + local_5a8.message.len,uVar16 - local_5a8.message.len);
          psVar1 = &(nc->recv_mbuf).len;
          *psVar1 = *psVar1 - sVar14;
          return;
        }
        uVar15 = (ulong)uVar7;
        uVar16 = (nc->recv_mbuf).len;
        if (uVar15 <= uVar16) {
          pcVar20 = (nc->recv_mbuf).buf;
          memmove(pcVar20,pcVar20 + uVar15,uVar16 - uVar15);
          psVar1 = &(nc->recv_mbuf).len;
          *psVar1 = *psVar1 - uVar15;
        }
        nc->proto_handler = websocket_handler;
        *(byte *)&nc->flags = (byte)nc->flags | 0x80;
        mg_call(nc,nc->handler,0x6f,&local_5a8);
        if ((nc->flags & 0x800) != 0) {
          return;
        }
        if ((nc->send_mbuf).len == 0) {
          ws_handshake(nc,pmVar8);
        }
      }
      mg_call(nc,nc->handler,0x70,(void *)0x0);
      websocket_handler(nc,3,ev_data);
      return;
    }
    if ((nc->recv_mbuf).len < 0x2000) {
      return;
    }
  }
  if (LL_DEBUG < s_cs_log_level) {
    http_handler_cold_1();
  }
  pbVar2 = (byte *)((long)&nc->flags + 1);
  *pbVar2 = *pbVar2 | 8;
  return;
}

Assistant:

void http_handler(struct mg_connection *nc, int ev, void *ev_data) {
    struct http_message shm;
    struct http_message *hm = &shm;
#endif
    struct mbuf *io = &nc->recv_mbuf;
    int req_len;
    const int is_req = (nc->listener != NULL);
#ifndef MG_DISABLE_HTTP_WEBSOCKET
    struct mg_str *vec;
#endif
    if (ev == MG_EV_CLOSE) {
        /*
     * For HTTP messages without Content-Length, always send HTTP message
     * before MG_EV_CLOSE message.
     */
        if (io->len > 0 && mg_parse_http(io->buf, io->len, hm, is_req) > 0) {
            int ev2 = is_req ? MG_EV_HTTP_REQUEST : MG_EV_HTTP_REPLY;
            hm->message.len = io->len;
            hm->body.len = io->buf + io->len - hm->body.p;
            mg_call(nc, nc->handler, ev2, hm);
        }
        free_http_proto_data(nc);
    }

    if (nc->proto_data != NULL) {
        transfer_file_data(nc);
    }

    mg_call(nc, nc->handler, ev, ev_data);

    if (ev == MG_EV_RECV) {
        struct mg_str *s;
        req_len = mg_parse_http(io->buf, io->len, hm, is_req);

        if (req_len > 0 &&
            (s = mg_get_http_header(hm, "Transfer-Encoding")) != NULL &&
            mg_vcasecmp(s, "chunked") == 0) {
            mg_handle_chunked(nc, hm, io->buf + req_len, io->len - req_len);
        }

        if (req_len < 0 || (req_len == 0 && io->len >= MG_MAX_HTTP_REQUEST_SIZE)) {
            DBG(("invalid request"));
            nc->flags |= MG_F_CLOSE_IMMEDIATELY;
        } else if (req_len == 0) {
            /* Do nothing, request is not yet fully buffered */
        }
#ifndef MG_DISABLE_HTTP_WEBSOCKET
        else if (nc->listener == NULL &&
                 mg_get_http_header(hm, "Sec-WebSocket-Accept")) {
            /* We're websocket client, got handshake response from server. */
            /* TODO(lsm): check the validity of accept Sec-WebSocket-Accept */
            mbuf_remove(io, req_len);
            nc->proto_handler = websocket_handler;
            nc->flags |= MG_F_IS_WEBSOCKET;
            mg_call(nc, nc->handler, MG_EV_WEBSOCKET_HANDSHAKE_DONE, NULL);
            websocket_handler(nc, MG_EV_RECV, ev_data);
        } else if (nc->listener != NULL &&
                   (vec = mg_get_http_header(hm, "Sec-WebSocket-Key")) != NULL) {
            /* This is a websocket request. Switch protocol handlers. */
            mbuf_remove(io, req_len);
            nc->proto_handler = websocket_handler;
            nc->flags |= MG_F_IS_WEBSOCKET;

            /* Send handshake */
            mg_call(nc, nc->handler, MG_EV_WEBSOCKET_HANDSHAKE_REQUEST, hm);
            if (!(nc->flags & MG_F_CLOSE_IMMEDIATELY)) {
                if (nc->send_mbuf.len == 0) {
                    ws_handshake(nc, vec);
                }
                mg_call(nc, nc->handler, MG_EV_WEBSOCKET_HANDSHAKE_DONE, NULL);
                websocket_handler(nc, MG_EV_RECV, ev_data);
            }
        }
#endif /* MG_DISABLE_HTTP_WEBSOCKET */
        else if (hm->message.len <= io->len) {
            int trigger_ev = nc->listener ? MG_EV_HTTP_REQUEST : MG_EV_HTTP_REPLY;

/* Whole HTTP message is fully buffered, call event handler */

#ifdef MG_ENABLE_JAVASCRIPT
                                                                                                                                    v7_val_t v1, v2, headers, req, args, res;
      struct v7 *v7 = nc->mgr->v7;
      const char *ev_name = trigger_ev == MG_EV_HTTP_REPLY ? "onsnd" : "onrcv";
      int i, js_callback_handled_request = 0;

      if (v7 != NULL) {
        /* Lookup JS callback */
        v1 = v7_get(v7, v7_get_global(v7), "Http", ~0);
        v2 = v7_get(v7, v1, ev_name, ~0);

        /* Create callback params. TODO(lsm): own/disown those */
        args = v7_create_array(v7);
        req = v7_create_object(v7);
        headers = v7_create_object(v7);

        /* Populate request object */
        v7_set(v7, req, "method", ~0, 0,
               v7_create_string(v7, hm->method.p, hm->method.len, 1));
        v7_set(v7, req, "uri", ~0, 0,
               v7_create_string(v7, hm->uri.p, hm->uri.len, 1));
        v7_set(v7, req, "body", ~0, 0,
               v7_create_string(v7, hm->body.p, hm->body.len, 1));
        v7_set(v7, req, "headers", ~0, 0, headers);
        for (i = 0; hm->header_names[i].len > 0; i++) {
          const struct mg_str *name = &hm->header_names[i];
          const struct mg_str *value = &hm->header_values[i];
          v7_set(v7, headers, name->p, name->len, 0,
                 v7_create_string(v7, value->p, value->len, 1));
        }

        /* Invoke callback. TODO(lsm): report errors */
        v7_array_push(v7, args, v7_create_foreign(nc));
        v7_array_push(v7, args, req);
        if (v7_apply(v7, v2, v7_create_undefined(), args, &res) == V7_OK &&
            v7_is_true(v7, res)) {
          js_callback_handled_request++;
        }
      }

      /* If JS callback returns true, stop request processing */
      if (js_callback_handled_request) {
        nc->flags |= MG_F_SEND_AND_CLOSE;
      } else {
        mg_call(nc, nc->handler, trigger_ev, hm);
      }
#else
            mg_call(nc, nc->handler, trigger_ev, hm);
#endif
            mbuf_remove(io, hm->message.len);
        }
    }
}